

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::parseAsContents(QPDFObjectHandle *this,ParserCallbacks *callbacks)

{
  QPDFObjGen local_60;
  string local_58;
  undefined1 local_38 [8];
  string description;
  ParserCallbacks *callbacks_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = callbacks;
  local_60 = getObjGen(this);
  QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_60,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "object ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  parseContentStream_internal(this,(string *)local_38,(ParserCallbacks *)description.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::parseAsContents(ParserCallbacks* callbacks)
{
    std::string description = "object " + getObjGen().unparse(' ');
    this->parseContentStream_internal(description, callbacks);
}